

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O2

any __thiscall
Scine::Core::ModuleManager::Impl::get(Impl *this,string *interface,string *model,string *moduleName)

{
  locale *plVar1;
  undefined8 *puVar2;
  pointer pcVar3;
  bool bVar4;
  char cVar5;
  locale *plVar6;
  undefined8 *puVar7;
  to_lowerF<char> tVar8;
  detail *in_R8;
  pointer pcVar9;
  undefined1 local_98 [8];
  string modulePtrLower;
  string moduleNameLower;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  tVar8.m_Loc = (locale *)moduleName;
  std::locale::locale((locale *)&modulePtrLower);
  boost::algorithm::detail::
  transform_range_copy<std::__cxx11::string,std::__cxx11::string,boost::algorithm::detail::to_lowerF<char>>
            (&moduleNameLower,in_R8,&modulePtrLower,tVar8);
  std::locale::~locale((locale *)&modulePtrLower);
  if (*(long *)(in_R8 + 8) != 0) {
    bVar4 = std::operator!=(&moduleNameLower,"any");
    if (bVar4) {
      plVar1 = (locale *)interface->_M_string_length;
      for (plVar6 = (locale *)(interface->_M_dataplus)._M_p; plVar6 != plVar1;
          plVar6 = plVar6 + 0x20) {
        puVar2 = *(undefined8 **)(plVar6 + 0x10);
        tVar8.m_Loc = plVar1;
        for (puVar7 = *(undefined8 **)(plVar6 + 8); puVar7 != puVar2; puVar7 = puVar7 + 2) {
          (**(code **)(*(long *)*puVar7 + 0x10))(&local_50);
          std::locale::locale((locale *)local_98);
          boost::algorithm::detail::
          transform_range_copy<std::__cxx11::string,std::__cxx11::string,boost::algorithm::detail::to_lowerF<char>>
                    (&modulePtrLower,(detail *)&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     tVar8);
          std::locale::~locale((locale *)local_98);
          std::__cxx11::string::~string((string *)&local_50);
          bVar4 = std::operator!=(&modulePtrLower,&moduleNameLower);
          if (bVar4) {
            std::operator+(&local_50,&moduleNameLower,"module");
            bVar4 = std::operator!=(&modulePtrLower,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            if (!bVar4) goto LAB_0010cb45;
          }
          else {
LAB_0010cb45:
            cVar5 = (**(code **)(*(long *)*puVar7 + 0x20))((long *)*puVar7,model,moduleName);
            if (cVar5 != '\0') {
              (**(code **)(*(long *)*puVar7 + 0x18))(this,(long *)*puVar7,model,moduleName);
              std::__cxx11::string::~string((string *)&modulePtrLower);
LAB_0010cc03:
              std::__cxx11::string::~string((string *)&moduleNameLower);
              return (any)(placeholder *)this;
            }
          }
          std::__cxx11::string::~string((string *)&modulePtrLower);
        }
      }
      goto LAB_0010cc22;
    }
  }
  pcVar3 = (pointer)interface->_M_string_length;
  for (pcVar9 = (interface->_M_dataplus)._M_p; pcVar9 != pcVar3; pcVar9 = pcVar9 + 0x20) {
    puVar2 = *(undefined8 **)(pcVar9 + 0x10);
    for (puVar7 = *(undefined8 **)(pcVar9 + 8); puVar7 != puVar2; puVar7 = puVar7 + 2) {
      cVar5 = (**(code **)(*(long *)*puVar7 + 0x20))((long *)*puVar7,model,moduleName);
      if (cVar5 != '\0') {
        (**(code **)(*(long *)*puVar7 + 0x18))(this,(long *)*puVar7,model,moduleName);
        goto LAB_0010cc03;
      }
    }
  }
LAB_0010cc22:
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = &PTR__exception_00115d38;
  __cxa_throw(puVar7,&ClassNotImplementedError::typeinfo,std::exception::~exception);
}

Assistant:

boost::any get(const std::string& interface, const std::string& model, const std::string& moduleName) const {
    std::string moduleNameLower = boost::algorithm::to_lower_copy(moduleName);
    if (!moduleName.empty() && moduleNameLower != "any") {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          std::string modulePtrLower = boost::algorithm::to_lower_copy(modulePtr->name());
          if ((modulePtrLower != moduleNameLower) && (modulePtrLower != moduleNameLower + "module")) {
            continue;
          }

          if (modulePtr->has(interface, model)) {
            return modulePtr->get(interface, model);
          }
        }
      }
    }
    else {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          if (modulePtr->has(interface, model)) {
            return modulePtr->get(interface, model);
          }
        }
      }
    }

    throw ClassNotImplementedError{};
  }